

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O2

bool bssl::ssl_parse_flags_extension_response
               (CBS *cbs,SSLFlags *out,uint8_t *out_alert,SSLFlags allowed_flags)

{
  bool bVar1;
  bool bVar2;
  
  bVar2 = false;
  bVar1 = ssl_parse_flags_extension(cbs,out,out_alert,false);
  if ((bVar1) && (bVar2 = true, (*out & ~allowed_flags) != 0)) {
    bVar2 = false;
    ERR_put_error(0x10,0,0xde,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                  ,0x1b1);
    *out_alert = '/';
  }
  return bVar2;
}

Assistant:

bool ssl_parse_flags_extension_response(const CBS *cbs, SSLFlags *out,
                                        uint8_t *out_alert,
                                        SSLFlags allowed_flags) {
  // In a response message, unsolicited flags are not allowed.
  if (!ssl_parse_flags_extension(cbs, out, out_alert,
                                 /*allow_unknown=*/false)) {
    return false;
  }

  // Check for unsolicited flags that fit in |SSLFlags|.
  if ((*out & allowed_flags) != *out) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_UNEXPECTED_EXTENSION);
    *out_alert = SSL_AD_ILLEGAL_PARAMETER;
    return false;
  }

  return true;
}